

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2sp_ref.c
# Opt level: O1

int blake2sp_init(blake2sp_state *S,size_t outlen)

{
  int iVar1;
  int iVar2;
  long lVar3;
  blake2s_param local_58;
  blake2sp_state *local_38;
  
  iVar2 = -1;
  if (0xffffffffffffffdf < outlen - 0x21) {
    memset(S->buf,0,0x208);
    S->outlen = outlen;
    local_58.key_length = '\0';
    local_58.fanout = '\b';
    local_58.depth = '\x02';
    local_58.leaf_length = 0;
    local_58.node_offset = 0;
    local_58.xof_length._0_1_ = 0;
    local_58._13_2_ = 0x100;
    local_58.inner_length = ' ';
    local_58.salt[0] = '\0';
    local_58.salt[1] = '\0';
    local_58.salt[2] = '\0';
    local_58.salt[3] = '\0';
    local_58.salt[4] = '\0';
    local_58.salt[5] = '\0';
    local_58.salt[6] = '\0';
    local_58.salt[7] = '\0';
    local_58.personal[0] = '\0';
    local_58.personal[1] = '\0';
    local_58.personal[2] = '\0';
    local_58.personal[3] = '\0';
    local_58.personal[4] = '\0';
    local_58.personal[5] = '\0';
    local_58.personal[6] = '\0';
    local_58.personal[7] = '\0';
    local_58.digest_length = (uint8_t)outlen;
    iVar1 = blake2s_init_param(S->R,&local_58);
    if (-1 < iVar1) {
      lVar3 = 0;
      local_38 = S;
      do {
        local_58.key_length = '\0';
        local_58.fanout = '\b';
        local_58.depth = '\x02';
        local_58.leaf_length = 0;
        local_58.node_offset = (uint32_t)(byte)lVar3;
        local_58.xof_length._0_1_ = 0;
        local_58._13_2_ = 0;
        local_58.inner_length = 0x20;
        local_58.salt[0] = '\0';
        local_58.salt[1] = '\0';
        local_58.salt[2] = '\0';
        local_58.salt[3] = '\0';
        local_58.salt[4] = '\0';
        local_58.salt[5] = '\0';
        local_58.salt[6] = '\0';
        local_58.salt[7] = '\0';
        local_58.personal[0] = '\0';
        local_58.personal[1] = '\0';
        local_58.personal[2] = '\0';
        local_58.personal[3] = '\0';
        local_58.personal[4] = '\0';
        local_58.personal[5] = '\0';
        local_58.personal[6] = '\0';
        local_58.personal[7] = '\0';
        local_58.digest_length = (uint8_t)outlen;
        iVar2 = blake2s_init_param((blake2s_state *)S,&local_58);
        S->S[0][0].outlen = (ulong)local_58.inner_length;
        if (iVar2 < 0) {
          return -1;
        }
        lVar3 = lVar3 + 1;
        S = (blake2sp_state *)(S->S + 1);
      } while (lVar3 != 8);
      local_38->R[0].last_node = '\x01';
      local_38->S[7][0].last_node = '\x01';
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int blake2sp_init( blake2sp_state *S, size_t outlen )
{
  size_t i;

  if( !outlen || outlen > BLAKE2S_OUTBYTES ) return -1;

  memset( S->buf, 0, sizeof( S->buf ) );
  S->buflen = 0;
  S->outlen = outlen;

  if( blake2sp_init_root( S->R, outlen, 0 ) < 0 )
    return -1;

  for( i = 0; i < PARALLELISM_DEGREE; ++i )
    if( blake2sp_init_leaf( S->S[i], outlen, 0, (uint32_t)i ) < 0 ) return -1;

  S->R->last_node = 1;
  S->S[PARALLELISM_DEGREE - 1]->last_node = 1;
  return 0;
}